

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

int mixed_buffer_from_pack(mixed_pack *in,mixed_buffer **outs,float *volume,float target_volume)

{
  mixed_encoding encoding;
  mixed_buffer *pmVar1;
  float *pfVar2;
  long lVar3;
  mixed_transfer_function_from p_Var4;
  void *pvVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  mixed_buffer **ppmVar8;
  byte bVar9;
  uint32_t uVar10;
  float **area;
  undefined8 uStack_80;
  undefined1 auStack_78 [4];
  uint local_74;
  undefined1 *local_70;
  uint local_68;
  char local_61;
  uint32_t i_1;
  int8_t c;
  float vol;
  uint8_t size;
  mixed_transfer_function_from fun;
  ulong uStack_48;
  uint32_t i;
  unsigned_long __vla_expr0;
  void *local_38;
  char *ind;
  uint32_t frames;
  uint32_t frames_to_bytes;
  mixed_channel_t channels;
  float *pfStack_20;
  float target_volume_local;
  float *volume_local;
  mixed_buffer **outs_local;
  mixed_pack *in_local;
  
  frames._3_1_ = in->channels;
  local_74 = (uint)frames._3_1_;
  uStack_80 = 0x1cbd46;
  frames_to_bytes = (uint32_t)target_volume;
  pfStack_20 = volume;
  volume_local = (float *)outs;
  outs_local = (mixed_buffer **)in;
  bVar9 = mixed_samplesize(in->encoding);
  ppmVar8 = outs_local;
  ind._4_4_ = local_74 * bVar9;
  ind._0_4_ = 0xffffffff;
  uStack_48 = (ulong)frames._3_1_;
  lVar3 = -(ulong)((uint)frames._3_1_ * 8 + 0xf & 0xfffffff0);
  local_70 = auStack_78 + lVar3;
  __vla_expr0 = (unsigned_long)auStack_78;
  *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cbd98;
  mixed_pack_request_read(&local_38,(uint32_t *)&ind,(mixed_pack *)ppmVar8);
  ind._0_4_ = (uint)ind / ind._4_4_;
  for (fun._4_4_ = 0; fun._4_4_ < frames._3_1_; fun._4_4_ = fun._4_4_ + 1) {
    area = (float **)(local_70 + (ulong)fun._4_4_ * 8);
    pmVar1 = *(mixed_buffer **)(volume_local + (ulong)fun._4_4_ * 2);
    *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cbdd7;
    mixed_buffer_request_write(area,(uint32_t *)&ind,pmVar1);
  }
  if ((uint)ind != 0) {
    _vol = transfer_array_functions_from[*(int *)(outs_local + 3) - 1];
    encoding = *(mixed_encoding *)(outs_local + 3);
    *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cbe16;
    c = mixed_samplesize(encoding);
    i_1 = (uint32_t)*pfStack_20;
    *pfStack_20 = (float)frames_to_bytes;
    for (local_61 = '\0'; uVar7 = frames_to_bytes, bVar9 = frames._3_1_, uVar6 = (uint)ind,
        pvVar5 = local_38, p_Var4 = _vol, uVar10 = i_1, (int)local_61 < (int)(uint)frames._3_1_;
        local_61 = local_61 + '\x01') {
      pfVar2 = *(float **)(local_70 + (long)local_61 * 8);
      *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cbe6d;
      (*p_Var4)(pvVar5,pfVar2,bVar9,uVar6,(float)uVar10,(float)uVar7);
      local_38 = (void *)((long)local_38 + (long)(int)(uint)(byte)c);
    }
  }
  ppmVar8 = outs_local;
  uVar10 = (uint)ind * ind._4_4_;
  *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cbe9b;
  mixed_pack_finish_read(uVar10,(mixed_pack *)ppmVar8);
  for (local_68 = 0; uVar10 = (uint)ind, local_68 < frames._3_1_; local_68 = local_68 + 1) {
    pmVar1 = *(mixed_buffer **)(volume_local + (ulong)local_68 * 2);
    *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x1cbec0;
    mixed_buffer_finish_write(uVar10,pmVar1);
  }
  return 1;
}

Assistant:

int mixed_buffer_from_pack(struct mixed_pack *in, struct mixed_buffer **outs, float *volume, float target_volume){
  mixed_channel_t channels = in->channels;
  uint32_t frames_to_bytes = channels * mixed_samplesize(in->encoding);
  uint32_t frames = UINT32_MAX;
  char *ind;
  float *outd[channels];

  mixed_pack_request_read((void**)&ind, &frames, in);
  frames = frames / frames_to_bytes;
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_request_write(&outd[i], &frames, outs[i]);

  if(0 < frames){
    mixed_transfer_function_from fun = transfer_array_functions_from[in->encoding-1];
    uint8_t size = mixed_samplesize(in->encoding);
    float vol = *volume;
    // KLUDGE: this is not necessarily correct...
    *volume = target_volume;
    for(int8_t c=0; c<channels; ++c){
      fun(ind, outd[c], channels, frames, vol, target_volume);
      ind += size;
    }
  }

  mixed_pack_finish_read(frames * frames_to_bytes, in);
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_finish_write(frames, outs[i]);
  
  return 1;
}